

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrss.cc
# Opt level: O2

void HRSS_poly3_invert(poly3 *out,poly3 *in)

{
  ulong uVar1;
  ulong uVar2;
  vec_t ms;
  vec_t ms_00;
  int i_1;
  uint uVar3;
  long lVar4;
  long lVar5;
  size_t i_2;
  uint uVar6;
  poly3 *ppVar7;
  poly2 *ppVar8;
  longlong *plVar9;
  ulong uVar10;
  size_t i;
  byte bVar11;
  vec_t swap;
  ulong uVar12;
  int iVar13;
  vec_t g_a [6];
  vec_t g_s [6];
  vec_t v_a [6];
  vec_t v_s [6];
  vec_t f_a [6];
  vec_t f_s [6];
  vec_t local_1a8;
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  undefined1 local_158 [16];
  vec_t r_s [6];
  poly3 in_reversed;
  vec_t ma;
  
  bVar11 = 0;
  v_s[0][0] = 0;
  v_s[0][1] = 0;
  v_s[1][0] = 0;
  v_s[1][1] = 0;
  v_s[2][0] = 0;
  v_s[2][1] = 0;
  v_s[3][0] = 0;
  v_s[3][1] = 0;
  v_s[4][0] = 0;
  v_s[4][1] = 0;
  v_s[5][0] = 0;
  v_s[5][1] = 0;
  v_a[0][0] = 0;
  v_a[0][1] = 0;
  v_a[1][0] = 0;
  v_a[1][1] = 0;
  v_a[2][0] = 0;
  v_a[2][1] = 0;
  v_a[3][0] = 0;
  v_a[3][1] = 0;
  v_a[4][0] = 0;
  v_a[4][1] = 0;
  v_a[5][0] = 0;
  v_a[5][1] = 0;
  r_s[0][0] = 0;
  r_s[0][1] = 0;
  r_s[1][0] = 0;
  r_s[1][1] = 0;
  r_s[2][0] = 0;
  r_s[2][1] = 0;
  r_s[3][0] = 0;
  r_s[3][1] = 0;
  r_s[4][0] = 0;
  r_s[4][1] = 0;
  r_s[5][0] = 0;
  r_s[5][1] = 0;
  local_158 = (undefined1  [16])0x0;
  local_168 = (undefined1  [16])0x0;
  local_178 = (undefined1  [16])0x0;
  local_188 = (undefined1  [16])0x0;
  local_198 = (undefined1  [16])0x0;
  local_1a8 = (vec_t)ZEXT416(1);
  f_s[5][0] = 0;
  f_s[5][1] = 0;
  f_s[4][0] = 0;
  f_s[4][1] = 0;
  f_s[3][0] = 0;
  f_s[3][1] = 0;
  f_s[2][0] = 0;
  f_s[2][1] = 0;
  f_s[1][0] = 0;
  f_s[1][1] = 0;
  f_s[0][0] = 0;
  f_s[0][1] = 0;
  f_a[4][0]._0_4_ = 0xffffffff;
  f_a[4][0]._4_4_ = 0xffffffff;
  f_a[4][1]._0_4_ = 0xffffffff;
  f_a[4][1]._4_4_ = 0xffffffff;
  f_a[3][0]._0_4_ = 0xffffffff;
  f_a[3][0]._4_4_ = 0xffffffff;
  f_a[3][1]._0_4_ = 0xffffffff;
  f_a[3][1]._4_4_ = 0xffffffff;
  f_a[2][0]._0_4_ = 0xffffffff;
  f_a[2][0]._4_4_ = 0xffffffff;
  f_a[2][1]._0_4_ = 0xffffffff;
  f_a[2][1]._4_4_ = 0xffffffff;
  f_a[1][0]._0_4_ = 0xffffffff;
  f_a[1][0]._4_4_ = 0xffffffff;
  f_a[1][1]._0_4_ = 0xffffffff;
  f_a[1][1]._4_4_ = 0xffffffff;
  f_a[0][0]._0_2_ = 0xffff;
  f_a[0][0]._2_2_ = 0xffff;
  f_a[0][0]._4_4_ = 0xffffffff;
  f_a[0][1]._0_4_ = 0xffffffff;
  f_a[0][1]._4_4_ = 0xffffffff;
  f_a[5][0] = 0x1fffffffffffffff;
  f_a[5][1] = 0;
  poly3_reverse_700(&in_reversed,in);
  g_s[5][0] = 0;
  g_s[5][1] = 0;
  lVar5 = 0xb;
  lVar4 = lVar5;
  ppVar7 = &in_reversed;
  plVar9 = g_s[0];
  for (; lVar4 != 0; lVar4 = lVar4 + -1) {
    *plVar9 = (ppVar7->s).v[0];
    ppVar7 = (poly3 *)((long)ppVar7 + (ulong)bVar11 * -0x10 + 8);
    plVar9 = plVar9 + (ulong)bVar11 * 0xfffffffffffffffe + 1;
  }
  g_a[5][0] = 0;
  g_a[5][1] = 0;
  ppVar8 = &in_reversed.a;
  plVar9 = g_a[0];
  for (; lVar5 != 0; lVar5 = lVar5 + -1) {
    *plVar9 = ppVar8->v[0];
    ppVar8 = (poly2 *)((long)ppVar8 + (ulong)bVar11 * -0x10 + 8);
    plVar9 = plVar9 + (ulong)bVar11 * 0xfffffffffffffffe + 1;
  }
  uVar6 = 1;
  for (lVar5 = 0; lVar5 != 0x577; lVar5 = lVar5 + 1) {
    uVar10 = 0;
    uVar12 = 0;
    for (lVar4 = 0; lVar4 != 0x60; lVar4 = lVar4 + 0x10) {
      uVar1 = *(ulong *)((long)v_s[0] + lVar4);
      uVar2 = *(ulong *)((long)v_s[0] + lVar4 + 8);
      *(ulong *)((long)v_s[0] + lVar4) = uVar1 * 2 | uVar12;
      *(ulong *)((long)v_s[0] + lVar4 + 8) = uVar1 >> 0x3f | uVar2 * 2;
      uVar12 = *(ulong *)((long)v_a[0] + lVar4);
      uVar1 = *(ulong *)((long)v_a[0] + lVar4 + 8);
      *(ulong *)((long)v_a[0] + lVar4) = uVar12 * 2 | uVar10;
      *(ulong *)((long)v_a[0] + lVar4 + 8) = uVar12 >> 0x3f | uVar1 * 2;
      uVar10 = uVar1 >> 0x3f;
      uVar12 = uVar2 >> 0x3f;
    }
    swap[0]._0_4_ = (uint)((long)(((ulong)(0 < (int)uVar6) & g_a[0][0]) << 0x3f) >> 0x3f);
    swap[0]._4_4_ = (uint)swap[0];
    swap[1]._0_4_ = (uint)swap[0];
    swap[1]._4_4_ = (uint)swap[0];
    iVar13 = (int)((long)((g_a[0][0] &
                          CONCAT44(f_a[0][0]._4_4_,CONCAT22(f_a[0][0]._2_2_,(ushort)f_a[0][0]))) <<
                         0x3f) >> 0x3f);
    ma[0] = CONCAT44(iVar13,iVar13);
    ma[1]._0_4_ = iVar13;
    ma[1]._4_4_ = iVar13;
    iVar13 = (int)((long)(((g_s[0][0] ^ f_s[0][0]) & ma[0]) << 0x3f) >> 0x3f);
    poly3_vec_cswap(f_s,f_a,g_s,g_a,swap);
    ms[0]._4_4_ = iVar13;
    ms[0]._0_4_ = iVar13;
    ms[1]._0_4_ = iVar13;
    ms[1]._4_4_ = iVar13;
    poly3_vec_fmsub(g_s,g_a,f_s,f_a,ms,ma);
    uVar10 = 0;
    uVar12 = 0;
    for (uVar3 = 5; -1 < (int)uVar3; uVar3 = uVar3 - 1) {
      uVar1 = g_s[uVar3][0];
      uVar2 = g_s[uVar3][1];
      g_s[uVar3][0] = uVar2 << 0x3f | uVar1 >> 1;
      g_s[uVar3][1] = uVar2 >> 1 | uVar12;
      uVar12 = g_a[uVar3][0];
      uVar2 = g_a[uVar3][1];
      g_a[uVar3][0] = uVar2 << 0x3f | uVar12 >> 1;
      g_a[uVar3][1] = uVar2 >> 1 | uVar10;
      uVar10 = uVar12 << 0x3f;
      uVar12 = uVar1 << 0x3f;
    }
    uVar6 = ((-uVar6 ^ uVar6) & -((uint)swap[0] & 1) ^ uVar6) + 1;
    poly3_vec_cswap(v_s,v_a,r_s,&local_1a8,swap);
    ms_00[0]._4_4_ = iVar13;
    ms_00[0]._0_4_ = iVar13;
    ms_00[1]._0_4_ = iVar13;
    ms_00[1]._4_4_ = iVar13;
    poly3_vec_fmsub(r_s,&local_1a8,v_s,v_a,ms_00,ma);
  }
  if (uVar6 == 0) {
    lVar5 = 0xb;
    lVar4 = lVar5;
    plVar9 = v_s[0];
    ppVar7 = out;
    for (; lVar4 != 0; lVar4 = lVar4 + -1) {
      (ppVar7->s).v[0] = *plVar9;
      plVar9 = plVar9 + (ulong)bVar11 * 0xfffffffffffffffe + 1;
      ppVar7 = (poly3 *)((long)ppVar7 + (ulong)bVar11 * -0x10 + 8);
    }
    plVar9 = v_a[0];
    ppVar8 = &out->a;
    for (; lVar5 != 0; lVar5 = lVar5 + -1) {
      ppVar8->v[0] = *plVar9;
      plVar9 = plVar9 + (ulong)bVar11 * 0xfffffffffffffffe + 1;
      ppVar8 = (poly2 *)((long)ppVar8 + (ulong)bVar11 * -0x10 + 8);
    }
    for (lVar5 = 0; lVar5 != 0xb; lVar5 = lVar5 + 1) {
      if (((ushort)f_a[0][0] & 1) == 0) {
        uVar10 = 0;
      }
      else {
        uVar10 = (out->a).v[lVar5];
      }
      (out->a).v[lVar5] = uVar10;
      (out->s).v[lVar5] = ((out->s).v[lVar5] ^ -(ulong)((ushort)f_s[0][0] & 1)) & uVar10;
    }
    poly3_reverse_700(out,out);
    return;
  }
  __assert_fail("delta == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hrss/hrss.cc"
                ,0x304,"void poly3_invert_vec(struct poly3 *, const struct poly3 *)");
}

Assistant:

void HRSS_poly3_invert(struct poly3 *out, const struct poly3 *in) {
  // The vector version of this function seems slightly slower on AArch64, but
  // is useful on ARMv7 and x86-64.
#if defined(HRSS_HAVE_VECTOR_UNIT) && !defined(OPENSSL_AARCH64)
  if (vec_capable()) {
    poly3_invert_vec(out, in);
    return;
  }
#endif

  // This algorithm is taken from section 7.1 of [SAFEGCD].
  struct poly3 v, r, f, g;
  // v = 0
  poly3_zero(&v);
  // r = 1
  poly3_zero(&r);
  r.a.v[0] = 1;
  // f = all ones.
  OPENSSL_memset(&f.s, 0, sizeof(struct poly2));
  OPENSSL_memset(&f.a, 0xff, sizeof(struct poly2));
  f.a.v[WORDS_PER_POLY - 1] >>= BITS_PER_WORD - BITS_IN_LAST_WORD;
  // g is the reversal of |in|.
  poly3_reverse_700(&g, in);
  int delta = 1;

  for (size_t i = 0; i < (2 * (N - 1)) - 1; i++) {
    poly3_lshift1(&v);

    const crypto_word_t delta_sign_bit = (delta >> (sizeof(delta) * 8 - 1)) & 1;
    const crypto_word_t delta_is_non_negative = delta_sign_bit - 1;
    const crypto_word_t delta_is_non_zero = ~constant_time_is_zero_w(delta);
    const crypto_word_t g_has_constant_term = lsb_to_all(g.a.v[0]);
    const crypto_word_t mask =
        g_has_constant_term & delta_is_non_negative & delta_is_non_zero;

    crypto_word_t c_s, c_a;
    poly3_word_mul(&c_s, &c_a, f.s.v[0], f.a.v[0], g.s.v[0], g.a.v[0]);
    c_s = lsb_to_all(c_s);
    c_a = lsb_to_all(c_a);

    delta = constant_time_select_int(mask, -delta, delta);
    delta++;

    poly3_cswap(&f, &g, mask);
    poly3_fmsub(&g, &f, c_s, c_a);
    poly3_rshift1(&g);

    poly3_cswap(&v, &r, mask);
    poly3_fmsub(&r, &v, c_s, c_a);
  }

  assert(delta == 0);
  poly3_mul_const(&v, f.s.v[0], f.a.v[0]);
  poly3_reverse_700(out, &v);
}